

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QObject ** __thiscall
QHash<QObject_*,_QString>::keyImpl(QHash<QObject_*,_QString> *this,QString *value)

{
  byte bVar1;
  char16_t *pcVar2;
  long lVar3;
  Span *pSVar4;
  Entry *pEVar5;
  ulong uVar6;
  bool bVar7;
  Data *pDVar8;
  ulong uVar9;
  QStringView rhs;
  QStringView lhs;
  
  pDVar8 = this->d;
  if (pDVar8 != (Data *)0x0) {
    if (pDVar8->spans->offsets[0] == 0xff) {
      uVar6 = 1;
      do {
        uVar9 = uVar6;
        if (pDVar8->numBuckets == uVar9) {
          pDVar8 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar6 = uVar9 + 1;
      } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      if (uVar9 == 0 && pDVar8 == (Data *)0x0) {
        return (QObject **)0x0;
      }
    }
    else {
      uVar9 = 0;
    }
    pcVar2 = (value->d).ptr;
    lVar3 = (value->d).size;
    do {
      pSVar4 = pDVar8->spans;
      pEVar5 = pSVar4[uVar9 >> 7].entries;
      bVar1 = pSVar4[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
      if ((*(long *)(pEVar5[bVar1].storage.data + 0x18) == lVar3) &&
         (rhs.m_data = pcVar2, rhs.m_size = lVar3,
         lhs.m_data = *(storage_type_conflict **)(pEVar5[bVar1].storage.data + 0x10),
         lhs.m_size = lVar3, bVar7 = QtPrivate::equalStrings(lhs,rhs), bVar7)) {
        return (QObject **)(pEVar5 + bVar1);
      }
      do {
        if (pDVar8->numBuckets - 1 == uVar9) {
          uVar9 = 0;
          pDVar8 = (Data *)0x0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (pSVar4[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((uVar9 != 0) || (pDVar8 != (Data *)0x0));
  }
  return (QObject **)0x0;
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }